

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

string_t __thiscall
duckdb::StringVector::AddString(StringVector *this,Vector *vector,char *data,idx_t len)

{
  uint uVar1;
  anon_union_16_2_67f50693_for_value aVar2;
  string_t data_00;
  uint uStack_1c;
  undefined4 uStack_18;
  undefined4 local_14;
  
  uVar1 = (uint)data;
  if (uVar1 < 0xd) {
    local_14 = 0;
    uStack_1c = 0;
    uStack_18 = 0;
    if (uVar1 == 0) {
      vector = (Vector *)0x0;
    }
    else {
      switchD_015de399::default(&uStack_1c,vector,(ulong)(uVar1 & 0xf));
      vector = (Vector *)CONCAT44(local_14,uStack_18);
    }
  }
  else {
    uStack_1c = *(uint *)vector;
    len = (idx_t)uStack_1c;
  }
  data_00.value.pointer.ptr = (char *)len;
  data_00.value._0_8_ = vector;
  aVar2.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       AddString(this,(Vector *)CONCAT44(uStack_1c,uVar1),data_00);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar2.pointer;
}

Assistant:

string_t StringVector::AddString(Vector &vector, const char *data, idx_t len) {
	return StringVector::AddString(vector, string_t(data, UnsafeNumericCast<uint32_t>(len)));
}